

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O0

uint dxil_spv::get_type_scalar_alignment(Impl *impl,Type *type)

{
  TypeID TVar1;
  uint uVar2;
  LoggingCallback p_Var3;
  void *pvVar4;
  char local_1038 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint scalar_alignment;
  Type *type_local;
  Impl *impl_local;
  
  TVar1 = LLVMBC::Type::getTypeID(type);
  switch(TVar1) {
  case HalfTyID:
    cb._4_4_ = 2;
    break;
  case FloatTyID:
    cb._4_4_ = 4;
    break;
  case DoubleTyID:
    cb._4_4_ = 8;
    break;
  case IntegerTyID:
    uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
    cb._4_4_ = uVar2 >> 3;
    break;
  default:
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Invalid type for scalar alignment query.\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1038,0x1000,"Invalid type for scalar alignment query.\n");
      pvVar4 = get_thread_log_callback_userdata();
      (*p_Var3)(pvVar4,Error,local_1038);
    }
    return 1;
  }
  if ((((impl->execution_mode_meta).native_16bit_operations & 1U) == 0) && (cb._4_4_ == 2)) {
    cb._4_4_ = 4;
  }
  return cb._4_4_;
}

Assistant:

unsigned get_type_scalar_alignment(Converter::Impl &impl, const llvm::Type *type)
{
	unsigned scalar_alignment;
	switch (type->getTypeID())
	{
	case llvm::Type::TypeID::IntegerTyID:
		scalar_alignment = type->getIntegerBitWidth() / 8;
		break;
	case llvm::Type::TypeID::HalfTyID:
		scalar_alignment = 2;
		break;
	case llvm::Type::TypeID::FloatTyID:
		scalar_alignment = 4;
		break;
	case llvm::Type::TypeID::DoubleTyID:
		scalar_alignment = 8;
		break;
	default:
		LOGE("Invalid type for scalar alignment query.\n");
		return 1;
	}

	if (!impl.execution_mode_meta.native_16bit_operations && scalar_alignment == 2)
		scalar_alignment = 4;

	return scalar_alignment;
}